

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O3

void __thiscall TPZAnalysis::Print(TPZAnalysis *this,string *name,ostream *out)

{
  long lVar1;
  ostream *poVar2;
  TPZConnect *this_00;
  TPZBaseMatrix *pTVar3;
  long nelem;
  
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  poVar2 = (ostream *)std::ostream::flush();
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (this->fCompMesh == (TPZCompMesh *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"No computational mesh\n",0x16);
  }
  else {
    lVar1 = (this->fCompMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
    if (0 < lVar1) {
      nelem = 0;
      do {
        this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                            (&(this->fCompMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                             nelem);
        if (this_00->fSequenceNumber != -1) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"Connect index ",0xe);
          poVar2 = std::ostream::_M_insert<long>((long)out);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          TPZConnect::Print(this_00,this->fCompMesh,out);
        }
        nelem = nelem + 1;
      } while (lVar1 != nelem);
    }
  }
  pTVar3 = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(&this->fSolution);
  (*(pTVar3->super_TPZSavable)._vptr_TPZSavable[0x1c])(pTVar3,"fSolution",out,0);
  if (this->fCompMesh == (TPZCompMesh *)0x0) {
    return;
  }
  TPZCompMesh::ConnectSolution(this->fCompMesh,out);
  return;
}

Assistant:

void TPZAnalysis::Print( const std::string &name, std::ostream &out) {
	out<<endl<<name<<endl;
    if (!fCompMesh) {
        out << "No computational mesh\n";
    }
    else
    {
        int64_t i,nelements = fCompMesh->ConnectVec().NElements();
        for(i=0;i<nelements;i++) {
            TPZConnect &gnod = fCompMesh->ConnectVec()[i];
            if(gnod.SequenceNumber()!=-1) {
                out << "Connect index " << i << endl;
                gnod.Print(*fCompMesh,out);
            }
        }
    }
    TPZBaseMatrix &sol = this->Solution();
	sol.Print("fSolution",out);
    if (fCompMesh) {
        fCompMesh->ConnectSolution(out);
    }
}